

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  QLayoutItem *pQVar2;
  bool bVar3;
  int iVar4;
  QDockAreaLayoutInfo *pQVar5;
  undefined4 extraout_var;
  QDockAreaLayoutInfo *pQVar6;
  QDockAreaLayoutInfo *unaff_RBP;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if ((this->item_list).d.size != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      this_00 = (QDockAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar7);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      bVar9 = false;
      pQVar5 = unaff_RBP;
      if (((!bVar3) &&
          ((bVar9 = true, pQVar5 = this, this->tabbed != true ||
           (&this->tabBar->super_QWidget != widget)))) &&
         ((pQVar2 = this_00->widgetItem, pQVar2 == (QLayoutItem *)0x0 ||
          (iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])(),
          (QWidget *)CONCAT44(extraout_var,iVar4) != widget)))) {
        pQVar5 = *(QDockAreaLayoutInfo **)((long)&pQVar1->subinfo + lVar7);
        if (pQVar5 == (QDockAreaLayoutInfo *)0x0) {
          bVar9 = false;
          pQVar5 = unaff_RBP;
        }
        else {
          pQVar6 = info(pQVar5,widget);
          bVar9 = pQVar6 != (QDockAreaLayoutInfo *)0x0;
          pQVar5 = unaff_RBP;
          if (bVar9) {
            pQVar5 = pQVar6;
          }
        }
      }
      if (bVar9) {
        return pQVar5;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x28;
      unaff_RBP = pQVar5;
    } while (uVar8 < (ulong)(this->item_list).d.size);
  }
  return (QDockAreaLayoutInfo *)0x0;
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(QWidget *widget)
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

#if QT_CONFIG(tabbar)
        if (tabbed && widget == tabBar)
            return this;
#endif

        if (item.widgetItem != nullptr && item.widgetItem->widget() == widget)
            return this;

        if (item.subinfo != nullptr) {
            if (QDockAreaLayoutInfo *result = item.subinfo->info(widget))
                return result;
        }
    }

    return nullptr;
}